

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool test9(void)

{
  bool bVar1;
  bool local_9a;
  int local_98;
  int local_94;
  int local_90;
  int i_6;
  int local_88;
  int i_5;
  int i_4;
  int i_3;
  int c;
  int i_2;
  int local_70;
  int i_1;
  int local_68;
  int i;
  int b2;
  int b1;
  int same;
  int f2;
  int f1;
  undefined1 local_48 [8];
  queue<int> b;
  queue<int> a;
  
  srand(0);
  CP::queue<int>::queue((queue<int> *)&b.mFront);
  CP::queue<int>::queue((queue<int> *)local_48);
  same = 100;
  b1 = 500;
  b2 = 9000;
  i = 10;
  local_68 = 100;
  for (i_1 = 0; i_1 < same; i_1 = i_1 + 1) {
    local_70 = rand();
    CP::queue<int>::push((queue<int> *)&b.mFront,&local_70);
  }
  for (i_2 = 0; i_2 < b1; i_2 = i_2 + 1) {
    c = rand();
    CP::queue<int>::push((queue<int> *)local_48,&c);
  }
  for (i_3 = 0; i_3 < b2; i_3 = i_3 + 1) {
    i_4 = rand();
    CP::queue<int>::push((queue<int> *)&b.mFront,&i_4);
    CP::queue<int>::push((queue<int> *)local_48,&i_4);
  }
  for (i_5 = 0; i_5 < same; i_5 = i_5 + 1) {
    CP::queue<int>::pop((queue<int> *)&b.mFront);
  }
  for (local_88 = 0; local_88 < b1; local_88 = local_88 + 1) {
    CP::queue<int>::pop((queue<int> *)local_48);
  }
  for (i_6 = 0; i_6 < i; i_6 = i_6 + 1) {
    local_90 = rand();
    CP::queue<int>::push((queue<int> *)&b.mFront,&local_90);
  }
  for (local_94 = 0; local_94 < local_68; local_94 = local_94 + 1) {
    local_98 = rand();
    CP::queue<int>::push((queue<int> *)local_48,&local_98);
  }
  bVar1 = CP::queue<int>::operator==((queue<int> *)&b.mFront,(queue<int> *)local_48);
  local_9a = false;
  if (!bVar1) {
    local_9a = CP::queue<int>::operator==((queue<int> *)local_48,(queue<int> *)&b.mFront);
    local_9a = !local_9a;
  }
  CP::queue<int>::~queue((queue<int> *)local_48);
  CP::queue<int>::~queue((queue<int> *)&b.mFront);
  return local_9a;
}

Assistant:

bool test9() {
  srand(0);
  CP::queue<int> a,b;
  int f1 = 100;
  int f2 = 500;
  int same = 9000;
  int b1 = 10;
  int b2 = 100;
  for (int i = 0;i < f1;i++) a.push(rand());
  for (int i = 0;i < f2;i++) b.push(rand());
  for (int i = 0;i < same;i++) {
    int c = rand();
    a.push(c);
    b.push(c);
  }
  for (int i = 0;i < f1;i++) a.pop();
  for (int i = 0;i < f2;i++) b.pop();
  for (int i = 0;i < b1;i++) a.push(rand());
  for (int i = 0;i < b2;i++) b.push(rand());
  return ( ((a == b) == false)  && ((b == a) == false));
}